

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csvmodelserialiser.cpp
# Opt level: O2

QString * __thiscall
CsvModelSerialiserPrivate::escapedCSV
          (QString *__return_storage_ptr__,CsvModelSerialiserPrivate *this,QString *unexc)

{
  bool bVar1;
  QLatin1Char local_6a;
  QLatin1Char local_69;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_48;
  QStringBuilder<QLatin1Char,_QString> local_30;
  QStringBuilder<QStringBuilder<QLatin1Char,_QString>,_QLatin1Char> local_20;
  
  bVar1 = QString::contains(unexc,&this->m_csvSeparator,CaseSensitive);
  if (bVar1) {
    local_6a.ch = '\"';
    local_48.d = (Data *)0x0;
    local_48.ptr = L"\"\"";
    local_48.size = 2;
    local_68.d = (Data *)0x0;
    local_68.ptr = (char16_t *)0x0;
    local_68.size = 0;
    local_30.b = (QString *)
                 QString::replace((QChar)(char16_t)unexc,(QString *)0x22,(CaseSensitivity)&local_48)
    ;
    local_30.a = &local_6a;
    local_20.a = &local_30;
    local_20.b = &local_69;
    local_69.ch = '\"';
    QStringBuilder<QStringBuilder<QLatin1Char,_QString>,_QLatin1Char>::convertTo<QString>
              (__return_storage_ptr__,&local_20);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  else {
    QString::QString(__return_storage_ptr__,unexc);
  }
  return __return_storage_ptr__;
}

Assistant:

QString CsvModelSerialiserPrivate::escapedCSV(QString unexc) const
{
    if (!unexc.contains(m_csvSeparator))
        return unexc;
    return QLatin1Char('\"') % unexc.replace(QLatin1Char('\"'), QStringLiteral("\"\"")) % QLatin1Char('\"');
}